

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printVectorIndex(MCInst *MI,uint OpNum,SStream *O)

{
  MCOperand *op;
  ulong uVar1;
  uint tmp;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  uVar1 = MCOperand_getImm(op);
  if ((uint)uVar1 < 10) {
    SStream_concat(O,"[%u]",uVar1 & 0xffffffff);
  }
  else {
    SStream_concat(O,"[0x%x]",uVar1 & 0xffffffff);
  }
  if (MI->csh->detail != CS_OPT_OFF) {
    *(uint *)(MI->flat_insn->detail->groups +
             (long)(int)((MI->flat_insn->detail->field_6).arm.op_count - 1) * 0x28 + 0x36) =
         (uint)uVar1;
  }
  return;
}

Assistant:

static void printVectorIndex(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned tmp = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	if (tmp > HEX_THRESHOLD)
		SStream_concat(O, "[0x%x]",tmp);
	else
		SStream_concat(O, "[%u]",tmp);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].vector_index = tmp;
	}
}